

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O2

void __thiscall soplex::LPColSetBase<double>::reMax(LPColSetBase<double> *this,int newmax)

{
  SVSetBase<double>::reMax(&this->super_SVSetBase<double>,newmax);
  VectorBase<double>::reSize(&this->up,(this->super_SVSetBase<double>).set.themax);
  VectorBase<double>::reSize(&this->low,(this->super_SVSetBase<double>).set.themax);
  VectorBase<double>::reSize(&this->object,(this->super_SVSetBase<double>).set.themax);
  DataArray<int>::reSize(&this->scaleExp,(this->super_SVSetBase<double>).set.themax);
  return;
}

Assistant:

void reMax(int newmax = 0)
   {
      SVSetBase<R>::reMax(newmax);
      up.reSize(max());
      low.reSize(max());
      object.reSize(max());
      scaleExp.reSize(max());
   }